

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O3

void __thiscall ipx::SparseMatrix::SortIndices(SparseMatrix *this)

{
  long lVar1;
  pointer piVar2;
  pointer pdVar3;
  long lVar4;
  bool bVar5;
  pointer piVar6;
  ulong uVar7;
  int iVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> work;
  allocator_type local_31;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_30;
  
  bVar5 = IsSorted(this);
  if (!bVar5) {
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              (&local_30,(long)this->nrow_,&local_31);
    piVar6 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->colptr_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar6) >> 2) + -1
       ) {
      lVar12 = 0;
      do {
        lVar11 = (long)piVar6[lVar12];
        iVar8 = piVar6[lVar12 + 1];
        if (piVar6[lVar12] < iVar8) {
          piVar2 = (this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = 0;
          lVar4 = 0;
          do {
            lVar10 = lVar4;
            *(int *)((long)&(local_30.
                             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first + lVar10) =
                 piVar2[lVar11 + uVar7];
            *(double *)
             ((long)&(local_30.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->second + lVar10) =
                 pdVar3[lVar11 + uVar7];
            iVar8 = piVar6[lVar12 + 1];
            lVar1 = lVar11 + uVar7;
            uVar7 = uVar7 + 1;
            lVar4 = lVar10 + 0x10;
          } while (lVar1 + 1 < (long)iVar8);
          if ((int)uVar7 != 0) {
            iVar8 = 0;
            if ((int)uVar7 != 1) {
              iVar8 = 0;
              do {
                iVar8 = iVar8 + 1;
                bVar5 = 3 < uVar7;
                uVar7 = uVar7 >> 1;
              } while (bVar5);
            }
            pdqsort_detail::
            pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,std::less<std::pair<int,double>>,false>
                      (local_30.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (long)&local_30.
                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].first + lVar10,iVar8,1);
            piVar6 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar8 = piVar6[lVar12 + 1];
          }
        }
        lVar11 = (long)piVar6[lVar12];
        if (piVar6[lVar12] < iVar8) {
          piVar2 = (this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (this->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar9 = &(local_30.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->second;
          do {
            piVar2[lVar11] = ((pair<int,_double> *)(pdVar9 + -1))->first;
            pdVar3[lVar11] = *pdVar9;
            lVar11 = lVar11 + 1;
            pdVar9 = pdVar9 + 2;
          } while (lVar11 < piVar6[lVar12 + 1]);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < ((long)(this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_finish - (long)piVar6) * 0x40000000 +
                        -0x100000000 >> 0x20);
    }
    if (local_30.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void SparseMatrix::SortIndices() {
    if (IsSorted())
        return;
    std::vector<std::pair<Int,double>> work(rows());
    for (Int j = 0; j < cols(); j++) {
        Int nz = 0;             // # entries in column j
        for (Int p = begin(j); p < end(j); p++) {
            work[nz].first = index(p);
            work[nz].second = value(p);
            nz++;
        }
        pdqsort(work.begin(), work.begin() + nz);
        for (Int k = 0, p = begin(j); p < end(j); k++, p++) {
            index(p) = work[k].first;
            value(p) = work[k].second;
        }
    }
}